

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.h
# Opt level: O2

void __thiscall vec<BoolView>::vec<BoolView>(vec<BoolView> *this,vec<BoolView> *other)

{
  uint uVar1;
  BoolView *pBVar2;
  BoolView *pBVar3;
  long lVar4;
  uint i;
  ulong uVar5;
  ulong uVar6;
  
  uVar1 = other->sz;
  uVar6 = (ulong)uVar1;
  this->sz = uVar1;
  this->cap = uVar1;
  pBVar3 = (BoolView *)malloc(uVar6 << 4);
  this->data = pBVar3;
  lVar4 = 8;
  for (uVar5 = 0; uVar5 < uVar6; uVar5 = uVar5 + 1) {
    pBVar3 = this->data;
    pBVar2 = other->data;
    *(undefined ***)((long)pBVar3 + lVar4 + -8) = &PTR_finished_001efbb8;
    *(undefined1 *)((long)&(pBVar3->super_Var).super_Branching._vptr_Branching + lVar4 + 4) =
         *(undefined1 *)((long)&(pBVar2->super_Var).super_Branching._vptr_Branching + lVar4 + 4);
    *(undefined4 *)((long)&(pBVar3->super_Var).super_Branching._vptr_Branching + lVar4) =
         *(undefined4 *)((long)&(pBVar2->super_Var).super_Branching._vptr_Branching + lVar4);
    uVar6 = (ulong)this->sz;
    lVar4 = lVar4 + 0x10;
  }
  return;
}

Assistant:

vec(vec<U>& other) : sz(other.size()), cap(sz) {
		assert(sizeof(U) == sizeof(T));
		data = (T*)malloc(cap * sizeof(T));
		for (unsigned int i = 0; i < sz; i++) {
			new (&data[i]) T(other[i]);
		}
		//		for (int i = 0; i < sz; i++) data[i] = other[i];
	}